

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O0

void __thiscall ByteString::ByteString(ByteString *this,char *hexString)

{
  ulong uVar1;
  char *pcVar2;
  ByteString *this_00;
  char *in_RSI;
  undefined8 *in_RDI;
  uchar byteVal;
  string byteStr;
  size_t i;
  string hex;
  uchar in_stack_ffffffffffffff2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  ulong local_70;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  char *local_10;
  
  *in_RDI = &PTR__ByteString_0017cc58;
  local_10 = in_RSI;
  std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_SecureAllocator<unsigned_char>_> *)0x13c7ac);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,local_10,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  uVar1 = std::__cxx11::string::size();
  if ((uVar1 & 1) != 0) {
    std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::__cxx11::string::operator=(local_30,local_68);
    std::__cxx11::string::~string(local_68);
  }
  local_70 = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= local_70) break;
    std::__cxx11::string::string((string *)&stack0xffffffffffffff70);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
    std::__cxx11::string::operator+=((string *)&stack0xffffffffffffff70,*pcVar2);
    this_00 = (ByteString *)std::__cxx11::string::operator[]((ulong)local_30);
    std::__cxx11::string::operator+=
              ((string *)&stack0xffffffffffffff70,*(char *)&this_00->_vptr_ByteString);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    strtoul(pcVar2,(char **)0x0,0x10);
    operator+=(this_00,in_stack_ffffffffffffff2f);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    local_70 = local_70 + 2;
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

ByteString::ByteString(const char* hexString)
{
	std::string hex = std::string(hexString);

	if (hex.size() % 2 != 0)
	{
		hex = "0" + hex;
	}

	for (size_t i = 0; i < hex.size(); i += 2)
	{
		std::string byteStr;
		byteStr += hex[i];
		byteStr += hex[i+1];

		unsigned char byteVal = (unsigned char) strtoul(byteStr.c_str(), NULL, 16);

		this->operator+=(byteVal);
	}
}